

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

void __thiscall
tonk::Connection::onResolve(Connection *this,error_code *error,results_type *results)

{
  ostringstream *poVar1;
  int iVar2;
  element_type *peVar3;
  OutputWorker *pOVar4;
  ErrorResult *pEVar5;
  Result lookupResult;
  Result local_1b8;
  Result local_1b0;
  undefined1 local_1a8 [392];
  
  if (((this->super_IConnection).SelfRefCount.Shutdown._M_base._M_i & 1U) != 0) {
    if (3 < (int)(this->Logger).ChannelMinLevel) {
      return;
    }
    local_1a8._0_8_ = (this->Logger).ChannelName;
    poVar1 = (ostringstream *)(local_1a8 + 0x10);
    local_1a8._8_4_ = Warning;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(this->Logger).Prefix._M_dataplus._M_p,
               (this->Logger).Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Ignoring onResolve() result during disco",0x28);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    return;
  }
  local_1b8.Error = (ErrorResult *)0x0;
  if (error->_M_value == 0) {
    peVar3 = (results->super_basic_resolver_iterator<asio::ip::tcp>).values_.
             super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((peVar3->
        super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(peVar3->
                 super__Vector_base<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>
                 )._M_impl.super__Vector_impl_data + 8)) goto LAB_00138494;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"No results","");
    pEVar5 = (ErrorResult *)operator_new(0x38);
    pEVar5->Source = "Connection::onResolve";
    (pEVar5->Description)._M_dataplus._M_p = (pointer)&(pEVar5->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar5->Description,local_1a8._0_8_,
               (char *)(local_1a8._0_8_ + CONCAT44(local_1a8._12_4_,local_1a8._8_4_)));
    pEVar5->Type = Tonk;
    pEVar5->Code = 3;
    local_1b0.Error = (ErrorResult *)0x0;
    local_1b8.Error = pEVar5;
    Result::~Result(&local_1b0);
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) goto LAB_00138494;
  }
  else {
    (**(code **)(*(long *)error->_M_cat + 0x20))(local_1a8);
    iVar2 = error->_M_value;
    pEVar5 = (ErrorResult *)operator_new(0x38);
    pEVar5->Source = "Connection::onResolve";
    (pEVar5->Description)._M_dataplus._M_p = (pointer)&(pEVar5->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar5->Description,local_1a8._0_8_,
               (char *)(local_1a8._0_8_ + CONCAT44(local_1a8._12_4_,local_1a8._8_4_)));
    pEVar5->Type = Asio;
    pEVar5->Code = (long)iVar2;
    local_1b0.Error = (ErrorResult *)0x0;
    local_1b8.Error = pEVar5;
    Result::~Result(&local_1b0);
    if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) goto LAB_00138494;
  }
  operator_delete((void *)local_1a8._0_8_);
LAB_00138494:
  if (local_1b8.Error == (ErrorResult *)0x0) {
    if ((int)(this->Logger).ChannelMinLevel < 2) {
      local_1a8._0_8_ = (this->Logger).ChannelName;
      poVar1 = (ostringstream *)(local_1a8 + 0x10);
      local_1a8._8_4_ = Debug;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(this->Logger).Prefix._M_dataplus._M_p,
                 (this->Logger).Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Resolve success: ",0x11)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," results",8);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1a8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    HostnameResolverState::InitializeResolvedAddressList
              ((this->ResolverState)._M_t.
               super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
               ._M_t.
               super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
               .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl,results);
    startConnectingToNextAddress(this);
  }
  else {
    RefCounter::StartShutdown(&(this->super_IConnection).SelfRefCount,3,&local_1b8);
  }
  Result::~Result(&local_1b8);
  return;
}

Assistant:

void Connection::onResolve(const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
{
    if (SelfRefCount.IsShutdown()) {
        Logger.Warning("Ignoring onResolve() result during disco");
        return;
    }

    Result lookupResult;
    if (error) {
        lookupResult = Result("Connection::onResolve", error.message(), ErrorType::Asio, error.value());
    }
    else if (results.empty()) {
        lookupResult = Result("Connection::onResolve", "No results", ErrorType::Tonk, Tonk_HostnameLookup);
    }

    if (lookupResult.IsFail()) {
        SelfRefCount.StartShutdown(Tonk_HostnameLookup, lookupResult);
        return;
    }

    Logger.Debug("Resolve success: ", results.size(), " results");

    ResolverState->InitializeResolvedAddressList(results);

    // Post a connect to this address
    startConnectingToNextAddress();
}